

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

Location * __thiscall
c4::yml::Parser::val_location(Location *__return_storage_ptr__,Parser *this,char *val)

{
  pfn_error p_Var1;
  code *pcVar2;
  size_t sVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  bool bVar15;
  Location *pLVar16;
  ulong *puVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  char *pcVar23;
  char *pcVar24;
  ulong uVar25;
  ulong *puVar26;
  size_t sVar27;
  byte bVar28;
  csubstr cVar29;
  long lStackY_280;
  char msg [36];
  char *pcStack_1c8;
  size_t local_1c0;
  char *pcStack_1a0;
  size_t local_198;
  char *pcStack_178;
  size_t local_170;
  char *pcStack_150;
  size_t local_148;
  char *pcStack_128;
  size_t local_120;
  char *pcStack_100;
  size_t local_f8;
  char *pcStack_d8;
  size_t local_d0;
  char *pcStack_b0;
  size_t local_a8;
  char *pcStack_88;
  size_t local_80;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_38;
  size_t local_30;
  
  bVar28 = 0;
  if (val == (char *)0x0) {
    pcVar23 = (this->m_file).str;
    sVar27 = (this->m_file).len;
    (__return_storage_ptr__->super_LineCol).col = 0;
    (__return_storage_ptr__->super_LineCol).offset = 0;
    (__return_storage_ptr__->super_LineCol).line = 0;
    (__return_storage_ptr__->name).str = pcVar23;
    lStackY_280 = 0x20;
  }
  else {
    if (((this->m_options).flags & 1) == 0) {
      builtin_strncpy(msg,"check failed: m_options.locations()",0x24);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_30 = cVar29.len;
      pcStack_38 = cVar29.str;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x8004) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x8004) << 0x40,8);
      LVar4.name.str = pcStack_38;
      LVar4.name.len = local_30;
      (*p_Var1)(msg,0x24,LVar4,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((this->m_buf).str != (this->m_newline_offsets_buf).str) {
      builtin_strncpy(msg + 0x20,"wlin",4);
      builtin_strncpy(msg + 0x10,"_buf.str == m_ne",0x10);
      builtin_strncpy(msg,"check failed: (m",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_58 = cVar29.len;
      pcStack_60 = cVar29.str;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x8007) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x8007) << 0x40,8);
      LVar5.name.str = pcStack_60;
      LVar5.name.len = local_58;
      (*p_Var1)(msg,0x37,LVar5,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((this->m_buf).len != (this->m_newline_offsets_buf).len) {
      builtin_strncpy(msg + 0x20,"wlin",4);
      builtin_strncpy(msg + 0x10,"_buf.len == m_ne",0x10);
      builtin_strncpy(msg,"check failed: (m",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_80 = cVar29.len;
      pcStack_88 = cVar29.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x8008) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x8008) << 0x40,8);
      LVar6.name.str = pcStack_88;
      LVar6.name.len = local_80;
      (*p_Var1)(msg,0x37,LVar6,(this->m_stack).m_callbacks.m_user_data);
    }
    if (((this->m_options).flags & 1) == 0) {
      builtin_strncpy(msg,"check failed: (m_options.locations()",0x24);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_a8 = cVar29.len;
      pcStack_b0 = cVar29.str;
      LVar7.super_LineCol.col = 0;
      LVar7.super_LineCol.offset = SUB168(ZEXT816(0x8009) << 0x40,0);
      LVar7.super_LineCol.line = SUB168(ZEXT816(0x8009) << 0x40,8);
      LVar7.name.str = pcStack_b0;
      LVar7.name.len = local_a8;
      (*p_Var1)(msg,0x26,LVar7,(this->m_stack).m_callbacks.m_user_data);
    }
    if (this->m_newline_offsets_size == 0) {
      builtin_strncpy(msg,"check failed: (!_locations_dirty())",0x24);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_d0 = cVar29.len;
      pcStack_d8 = cVar29.str;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x800a) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x800a) << 0x40,8);
      LVar8.name.str = pcStack_d8;
      LVar8.name.len = local_d0;
      (*p_Var1)(msg,0x24,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
    if (this->m_newline_offsets == (size_t *)0x0) {
      builtin_strncpy(msg + 0x20," != ",4);
      builtin_strncpy(msg + 0x10,"_newline_offsets",0x10);
      builtin_strncpy(msg,"check failed: (m",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_f8 = cVar29.len;
      pcStack_100 = cVar29.str;
      LVar9.super_LineCol.col = 0;
      LVar9.super_LineCol.offset = SUB168(ZEXT816(0x800b) << 0x40,0);
      LVar9.super_LineCol.line = SUB168(ZEXT816(0x800b) << 0x40,8);
      LVar9.name.str = pcStack_100;
      LVar9.name.len = local_f8;
      (*p_Var1)(msg,0x2d,LVar9,(this->m_stack).m_callbacks.m_user_data);
    }
    if (this->m_newline_offsets_size == 0) {
      builtin_strncpy(msg + 0x20,"_siz",4);
      builtin_strncpy(msg + 0x10,"_newline_offsets",0x10);
      builtin_strncpy(msg,"check failed: (m",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_120 = cVar29.len;
      pcStack_128 = cVar29.str;
      LVar10.super_LineCol.col = 0;
      LVar10.super_LineCol.offset = SUB168(ZEXT816(0x800c) << 0x40,0);
      LVar10.super_LineCol.line = SUB168(ZEXT816(0x800c) << 0x40,8);
      LVar10.name.str = pcStack_128;
      LVar10.name.len = local_120;
      (*p_Var1)(msg,0x2b,LVar10,(this->m_stack).m_callbacks.m_user_data);
    }
    pcVar23 = (this->m_buf).str;
    if ((val < pcVar23) || (pcVar23 + (this->m_buf).len < val)) {
      pcVar21 = 
      "check failed: (val >= src.begin() && val <= src.end()) || (src.str == nullptr && val == nullptr)"
      ;
      pcVar24 = msg;
      for (lVar18 = 0x61; lVar18 != 0; lVar18 = lVar18 + -1) {
        *pcVar24 = *pcVar21;
        pcVar21 = pcVar21 + (ulong)bVar28 * -2 + 1;
        pcVar24 = pcVar24 + (ulong)bVar28 * -2 + 1;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_148 = cVar29.len;
      pcStack_150 = cVar29.str;
      LVar11.super_LineCol.col = 0;
      LVar11.super_LineCol.offset = SUB168(ZEXT816(0x8010) << 0x40,0);
      LVar11.super_LineCol.line = SUB168(ZEXT816(0x8010) << 0x40,8);
      LVar11.name.str = pcStack_150;
      LVar11.name.len = local_148;
      (*p_Var1)(msg,0x61,LVar11,(this->m_stack).m_callbacks.m_user_data);
    }
    sVar27 = (long)val - (long)pcVar23;
    puVar17 = this->m_newline_offsets;
    uVar19 = this->m_newline_offsets_size;
    uVar20 = uVar19;
    puVar26 = puVar17;
    if (uVar19 < 0x1e) {
      for (; puVar26 < puVar17 + uVar19; puVar26 = puVar26 + 1) {
        if (sVar27 < *puVar26) goto LAB_001e7bd0;
      }
      puVar26 = (ulong *)0x0;
    }
    else {
      while (uVar20 != 0) {
        uVar22 = uVar20 >> 1;
        uVar25 = ~uVar22 + uVar20;
        uVar20 = uVar22;
        if (puVar26[uVar22] < sVar27) {
          uVar20 = uVar25;
          puVar26 = puVar26 + uVar22 + 1;
        }
      }
    }
LAB_001e7bd0:
    if (puVar26 < puVar17) {
      builtin_strncpy(msg + 0x20,"ine_",4);
      builtin_strncpy(msg + 0x10,"ineptr >= m_newl",0x10);
      builtin_strncpy(msg,"check failed: (l",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_170 = cVar29.len;
      pcStack_178 = cVar29.str;
      LVar12.super_LineCol.col = 0;
      LVar12.super_LineCol.offset = SUB168(ZEXT816(0x803a) << 0x40,0);
      LVar12.super_LineCol.line = SUB168(ZEXT816(0x803a) << 0x40,8);
      LVar12.name.str = pcStack_178;
      LVar12.name.len = local_170;
      (*p_Var1)(msg,0x2d,LVar12,(this->m_stack).m_callbacks.m_user_data);
      puVar17 = this->m_newline_offsets;
      uVar19 = this->m_newline_offsets_size;
    }
    if (puVar17 + uVar19 < puVar26) {
      pcVar23 = "check failed: (lineptr <= m_newline_offsets + m_newline_offsets_size)";
      pcVar21 = msg;
      for (lVar18 = 0x46; lVar18 != 0; lVar18 = lVar18 + -1) {
        *pcVar21 = *pcVar23;
        pcVar23 = pcVar23 + (ulong)bVar28 * -2 + 1;
        pcVar21 = pcVar21 + (ulong)bVar28 * -2 + 1;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_198 = cVar29.len;
      pcStack_1a0 = cVar29.str;
      LVar13.super_LineCol.col = 0;
      LVar13.super_LineCol.offset = SUB168(ZEXT816(0x803b) << 0x40,0);
      LVar13.super_LineCol.line = SUB168(ZEXT816(0x803b) << 0x40,8);
      LVar13.name.str = pcStack_1a0;
      LVar13.name.len = local_198;
      (*p_Var1)(msg,0x46,LVar13,(this->m_stack).m_callbacks.m_user_data);
    }
    if (*puVar26 <= sVar27) {
      builtin_strncpy(msg,"check failed: (*lineptr > offset)",0x22);
      if ((((byte)s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
        pcVar2 = (code *)swi(3);
        pLVar16 = (Location *)(*pcVar2)();
        return pLVar16;
      }
      p_Var1 = (this->m_stack).m_callbacks.m_error;
      cVar29 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_1c0 = cVar29.len;
      pcStack_1c8 = cVar29.str;
      LVar14.super_LineCol.col = 0;
      LVar14.super_LineCol.offset = SUB168(ZEXT816(0x803c) << 0x40,0);
      LVar14.super_LineCol.line = SUB168(ZEXT816(0x803c) << 0x40,8);
      LVar14.name.str = pcStack_1c8;
      LVar14.name.len = local_1c0;
      (*p_Var1)(msg,0x22,LVar14,(this->m_stack).m_callbacks.m_user_data);
    }
    (__return_storage_ptr__->super_LineCol).col = 0;
    sVar3 = (this->m_file).len;
    (__return_storage_ptr__->name).str = (this->m_file).str;
    (__return_storage_ptr__->name).len = sVar3;
    (__return_storage_ptr__->super_LineCol).offset = sVar27;
    puVar17 = this->m_newline_offsets;
    (__return_storage_ptr__->super_LineCol).line = (long)puVar26 - (long)puVar17 >> 3;
    lStackY_280 = 0x10;
    if (puVar17 < puVar26) {
      sVar27 = sVar27 + ~puVar26[-1];
    }
  }
  *(size_t *)((long)&(__return_storage_ptr__->super_LineCol).offset + lStackY_280) = sVar27;
  return __return_storage_ptr__;
}

Assistant:

Location Parser::val_location(const char *val) const
{
    if(C4_UNLIKELY(val == nullptr))
        return {m_file, 0, 0, 0};

    _RYML_CB_CHECK(m_stack.m_callbacks, m_options.locations());
    // NOTE: if any of these checks fails, the parser needs to be
    // instantiated with locations enabled.
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.str == m_newline_offsets_buf.str);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.len == m_newline_offsets_buf.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_options.locations());
    _RYML_CB_ASSERT(m_stack.m_callbacks, !_locations_dirty());
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_newline_offsets != nullptr);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_newline_offsets_size > 0);
    // NOTE: the pointer needs to belong to the buffer that was used to parse.
    csubstr src = m_buf;
    _RYML_CB_CHECK(m_stack.m_callbacks, val != nullptr || src.str == nullptr);
    _RYML_CB_CHECK(m_stack.m_callbacks, (val >= src.begin() && val <= src.end()) || (src.str == nullptr && val == nullptr));
    // ok. search the first stored newline after the given ptr
    using lineptr_type = size_t const* C4_RESTRICT;
    lineptr_type lineptr = nullptr;
    size_t offset = (size_t)(val - src.begin());
    if(m_newline_offsets_size < 30) // TODO magic number
    {
        // just do a linear search if the size is small.
        for(lineptr_type curr = m_newline_offsets, last = m_newline_offsets + m_newline_offsets_size; curr < last; ++curr)
        {
            if(*curr > offset)
            {
                lineptr = curr;
                break;
            }
        }
    }
    else
    {
        // do a bisection search if the size is not small.
        //
        // We could use std::lower_bound but this is simple enough and
        // spares the include of <algorithm>.
        size_t count = m_newline_offsets_size;
        size_t step;
        lineptr_type it;
        lineptr = m_newline_offsets;
        while(count)
        {
            step = count >> 1;
            it = lineptr + step;
            if(*it < offset)
            {
                lineptr = ++it;
                count -= step + 1;
            }
            else
            {
                count = step;
            }
        }
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, lineptr >= m_newline_offsets);
    _RYML_CB_ASSERT(m_stack.m_callbacks, lineptr <= m_newline_offsets + m_newline_offsets_size);
    _RYML_CB_ASSERT(m_stack.m_callbacks, *lineptr > offset);
    Location loc;
    loc.name = m_file;
    loc.offset = offset;
    loc.line = (size_t)(lineptr - m_newline_offsets);
    if(lineptr > m_newline_offsets)
        loc.col = (offset - *(lineptr-1) - 1u);
    else
        loc.col = offset;
    return loc;
}